

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_rando_world_edits.hpp
# Opt level: O2

void PatchRandoWorldEdits::put_orcs_back_in_room_before_boss_swamp_shrine(World *world)

{
  pointer pGVar1;
  Map *pMVar2;
  Entity *pEVar3;
  EntityMaskFlag local_38;
  
  pMVar2 = World::map(world,0x1e);
  pGVar1 = (pMVar2->_global_entity_mask_flags).
           super__Vector_base<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((pMVar2->_global_entity_mask_flags).
      super__Vector_base<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>._M_impl.
      super__Vector_impl_data._M_finish != pGVar1) {
    (pMVar2->_global_entity_mask_flags).
    super__Vector_base<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>._M_impl.
    super__Vector_impl_data._M_finish = pGVar1;
  }
  pMVar2 = World::map(world,0x1e);
  Map::remove_entity(pMVar2,'\x05',true);
  pMVar2 = World::map(world,0x1e);
  pEVar3 = Map::entity(pMVar2,'\x01');
  local_38.super_Flag.byte = 2;
  local_38.super_Flag.bit = '\x05';
  local_38.super_Flag._11_1_ = 0;
  local_38.super_Flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00246e68;
  std::vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::emplace_back<EntityMaskFlag>
            (&(pEVar3->_attrs).mask_flags,&local_38);
  pMVar2 = World::map(world,0x1e);
  pEVar3 = Map::entity(pMVar2,'\x02');
  local_38.super_Flag.byte = 2;
  local_38.super_Flag.bit = '\x05';
  local_38.super_Flag._11_1_ = 0;
  local_38.super_Flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00246e68;
  std::vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::emplace_back<EntityMaskFlag>
            (&(pEVar3->_attrs).mask_flags,&local_38);
  return;
}

Assistant:

static void put_orcs_back_in_room_before_boss_swamp_shrine(World& world)
    {
        // In map before boss, put the orcs back and only remove the locked door
        world.map(MAP_SWAMP_SHRINE_ROOM_BEFORE_BOSS)->global_entity_mask_flags().clear();
        world.map(MAP_SWAMP_SHRINE_ROOM_BEFORE_BOSS)->remove_entity(5);
        // Remove the door orcs if Fara has been freed
        world.map(MAP_SWAMP_SHRINE_ROOM_BEFORE_BOSS)->entity(1)->mask_flags().emplace_back(EntityMaskFlag(false, 2, 5));
        world.map(MAP_SWAMP_SHRINE_ROOM_BEFORE_BOSS)->entity(2)->mask_flags().emplace_back(EntityMaskFlag(false, 2, 5));
    }